

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O2

void writeTiledRgbaONE1(char *fileName,Rgba *pixels,int width,int height,int tileWidth,
                       int tileHeight)

{
  int iVar1;
  int iVar2;
  float in_XMM2_Da;
  TiledRgbaOutputFile out;
  undefined8 local_38;
  
  local_38 = 0;
  Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            (&out,fileName,width,height,tileWidth,tileHeight,ONE_LEVEL,ROUND_DOWN,WRITE_RGBA,1.0,
             (V2f)0x3f800000,in_XMM2_Da,(LineOrder)&local_38,NO_COMPRESSION,3);
  Imf_2_5::TiledRgbaOutputFile::setFrameBuffer(&out,pixels,1,(long)width);
  iVar1 = Imf_2_5::TiledRgbaOutputFile::numXTiles(&out,0);
  iVar2 = Imf_2_5::TiledRgbaOutputFile::numYTiles(&out,0);
  Imf_2_5::TiledRgbaOutputFile::writeTiles(&out,0,iVar1 + -1,0,iVar2 + -1,0);
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  return;
}

Assistant:

void
writeTiledRgbaONE1 (const char fileName[],
                    const Rgba *pixels,
                    int width, int height,
                    int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with one level using an image-sized framebuffer.
    //

    TiledRgbaOutputFile out (fileName,
                             width, height,		// image size
                             tileWidth, tileHeight,	// tile size
                             ONE_LEVEL,			// level mode
			     ROUND_DOWN,		// rounding mode
                             WRITE_RGBA);		// channels in file

    out.setFrameBuffer (pixels, 1, width);
    out.writeTiles (0, out.numXTiles() - 1, 0, out.numYTiles() - 1);
}